

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

__m256i * xy_y_convolve_2tap_8x2_half_pel_avx2(int16_t *src,__m128i *s_128)

{
  longlong lVar1;
  undefined1 auVar2 [32];
  __m256i alVar3;
  __m256i *in_RSI;
  long in_RDI;
  undefined1 auVar4 [16];
  __m256i s_256 [2];
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  
  lVar1 = *(longlong *)(in_RDI + 0x18);
  (*in_RSI)[2] = *(longlong *)(in_RDI + 0x10);
  (*in_RSI)[3] = lVar1;
  alVar3 = *in_RSI;
  lVar1 = *(longlong *)(in_RDI + 0x28);
  (*in_RSI)[0] = *(longlong *)(in_RDI + 0x20);
  (*in_RSI)[1] = lVar1;
  auVar4 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) * *(undefined1 (*) [16])*in_RSI;
  uStack_d0 = auVar4._0_8_;
  uStack_c8 = auVar4._8_8_;
  auVar2._16_8_ = uStack_d0;
  auVar2._0_16_ =
       ZEXT116(0) * *(undefined1 (*) [16])*in_RSI + ZEXT116(1) * *(undefined1 (*) [16])(*in_RSI + 2)
  ;
  auVar2._24_8_ = uStack_c8;
  vpaddw_avx2((undefined1  [32])alVar3,auVar2);
  return in_RSI;
}

Assistant:

static inline __m256i xy_y_convolve_2tap_8x2_half_pel_avx2(
    const int16_t *const src, __m128i s_128[2]) {
  __m256i s_256[2];
  s_128[1] = _mm_loadu_si128((__m128i *)(src + 8));
  s_256[0] = _mm256_setr_m128i(s_128[0], s_128[1]);
  s_128[0] = _mm_loadu_si128((__m128i *)(src + 2 * 8));
  s_256[1] = _mm256_setr_m128i(s_128[1], s_128[0]);
  return _mm256_add_epi16(s_256[0], s_256[1]);
}